

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catbtor.c
# Opt level: O2

int32_t main(int32_t argc,char **argv)

{
  char *pcVar1;
  int iVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  undefined8 uVar5;
  long lVar6;
  char *pcVar7;
  ulong uVar8;
  char *pcVar9;
  int iVar10;
  size_t sStack_50;
  undefined1 local_40 [16];
  
  iVar10 = 0;
  pcVar9 = input_name;
  for (lVar6 = 1; lVar6 < argc; lVar6 = lVar6 + 1) {
    pcVar7 = argv[lVar6];
    if (*pcVar7 == '-') {
      if ((pcVar7[1] == 'h') && (pcVar7[2] == '\0')) {
        pcVar9 = "usage: catbtor [-h|-v] [ <btorfile> ]\n";
        goto LAB_001015c7;
      }
      if ((pcVar7[1] != 'v') || (pcVar7[2] != '\0')) {
        pcVar9 = "*** catbtor: invalid option \'%s\' (try \'-h\')\n";
        goto LAB_00101582;
      }
      iVar10 = iVar10 + 1;
      pcVar7 = pcVar9;
      pcVar1 = input_name;
    }
    else {
      pcVar1 = pcVar7;
      if (pcVar9 != (char *)0x0) {
        pcVar9 = "*** catbtor: too many inputs (try \'-h\')\n";
        sStack_50 = 0x28;
        goto LAB_001015c9;
      }
    }
    input_name = pcVar1;
    pcVar9 = pcVar7;
  }
  if (pcVar9 == (char *)0x0) {
    input_file = _stdin;
    input_name = "<stdin>";
  }
  else {
    input_file = (FILE *)fopen(pcVar9,"r");
    if ((FILE *)input_file == (FILE *)0x0) {
      pcVar9 = "*** catbtor: can not open \'%s\' for reading\n";
      pcVar7 = input_name;
LAB_00101582:
      fprintf(_stderr,pcVar9,pcVar7);
      goto LAB_001014f7;
    }
    close_input = '\x01';
  }
  if (iVar10 != 0) {
    fprintf(_stderr,"; [catbor] simple CAT for BTOR files\n; [catbor] reading \'%s\'\n",input_name);
    fflush(_stderr);
  }
  uVar3 = btor2parser_new();
  iVar2 = btor2parser_read_lines(uVar3,input_file);
  if (iVar2 != 0) {
    if (close_input == '\x01') {
      fclose((FILE *)input_file);
    }
    if (iVar10 != 0) {
      fprintf(_stderr,"; [catbor] finished parsing \'%s\'\n",input_name);
      fflush(_stderr);
      fwrite("; [catbor] starting to dump BTOR model to \'<stdout>\'\n",0x35,1,_stderr);
      fflush(_stderr);
    }
    local_40 = btor2parser_iter_init(uVar3);
    do {
      puVar4 = (undefined8 *)btor2parser_iter_next(local_40);
      if (puVar4 == (undefined8 *)0x0) {
        btor2parser_delete(uVar3);
        if (iVar10 != 0) {
          fwrite("; [catbor] finished dumping BTOR model to \'<stdout>\'\n",0x35,1,_stderr);
          fflush(_stderr);
        }
        return 0;
      }
      printf("%ld %s",*puVar4,puVar4[2]);
      if (*(int *)(puVar4 + 3) == 0x2d) {
        printf(" %s",puVar4[6]);
        if (*(int *)(puVar4 + 5) == 0) {
          printf(" %ld %ld",puVar4[7],puVar4[8]);
        }
        else {
          if (*(int *)(puVar4 + 5) != 1) {
            pcVar9 = "*** catbtor: invalid sort encountered\n";
LAB_001015c7:
            sStack_50 = 0x26;
LAB_001015c9:
            fwrite(pcVar9,sStack_50,1,_stderr);
            goto LAB_001014f7;
          }
          printf(" %u",(ulong)*(uint *)(puVar4 + 7));
        }
      }
      else if (puVar4[4] != 0) {
        printf(" %ld");
      }
      for (uVar8 = 0; uVar8 < *(uint *)(puVar4 + 0xd); uVar8 = uVar8 + 1) {
        printf(" %ld",*(undefined8 *)(puVar4[0xe] + uVar8 * 8));
      }
      iVar2 = *(int *)(puVar4 + 3);
      if (iVar2 == 0x29) {
        printf(" %ld %ld",*(undefined8 *)(puVar4[0xe] + 8),*(undefined8 *)(puVar4[0xe] + 0x10));
        iVar2 = *(int *)(puVar4 + 3);
      }
      if ((iVar2 == 0x38) || (iVar2 == 0x26)) {
        printf(" %ld",*(undefined8 *)(puVar4[0xe] + 8));
      }
      if (puVar4[0xb] != 0) {
        printf(" %s");
      }
      if (puVar4[0xc] != 0) {
        printf(" %s");
      }
      fputc(10,_stdout);
    } while( true );
  }
  uVar5 = btor2parser_error(uVar3);
  fprintf(_stderr,"*** catbtor: parse error in \'%s\' %s\n",input_name,uVar5);
  btor2parser_delete(uVar3);
  if (close_input == '\x01') {
    fclose((FILE *)input_file);
  }
LAB_001014f7:
  exit(1);
}

Assistant:

int32_t
main (int32_t argc, char** argv)
{
  Btor2Parser* reader;
  Btor2LineIterator it;
  Btor2Line* l;
  uint32_t j;
  int32_t i, verbosity = 0;
  const char* err;
  for (i = 1; i < argc; i++)
  {
    if (!strcmp (argv[i], "-h"))
    {
      fprintf (stderr, "usage: catbtor [-h|-v] [ <btorfile> ]\n");
      exit (1);
    }
    else if (!strcmp (argv[i], "-v"))
      verbosity++;
    else if (argv[i][0] == '-')
    {
      fprintf (
          stderr, "*** catbtor: invalid option '%s' (try '-h')\n", argv[i]);
      exit (1);
    }
    else if (input_name)
    {
      fprintf (stderr, "*** catbtor: too many inputs (try '-h')\n");
      exit (1);
    }
    else
      input_name = argv[i];
  }
  if (!input_name)
  {
    input_file = stdin;
    assert (!close_input);
    input_name = "<stdin>";
  }
  else
  {
    input_file = fopen (input_name, "r");
    if (!input_file)
    {
      fprintf (
          stderr, "*** catbtor: can not open '%s' for reading\n", input_name);
      exit (1);
    }
    close_input = 1;
  }
  if (verbosity)
  {
    fprintf (stderr,
             "; [catbor] simple CAT for BTOR files\n"
             "; [catbor] reading '%s'\n",
             input_name);
    fflush (stderr);
  }
  reader = btor2parser_new ();
  if (!btor2parser_read_lines (reader, input_file))
  {
    err = btor2parser_error (reader);
    assert (err);
    fprintf (stderr, "*** catbtor: parse error in '%s' %s\n", input_name, err);
    btor2parser_delete (reader);
    if (close_input) fclose (input_file);
    exit (1);
  }
  if (close_input) fclose (input_file);
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] finished parsing '%s'\n", input_name);
    fflush (stderr);
  }
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] starting to dump BTOR model to '<stdout>'\n");
    fflush (stderr);
  }
  it = btor2parser_iter_init (reader);
  while ((l = btor2parser_iter_next (&it)))
  {
    printf ("%" PRId64 " %s", l->id, l->name);
    if (l->tag == BTOR2_TAG_sort)
    {
      printf (" %s", l->sort.name);
      switch (l->sort.tag)
      {
        case BTOR2_TAG_SORT_bitvec: printf (" %u", l->sort.bitvec.width); break;
        case BTOR2_TAG_SORT_array:
          printf (" %" PRId64 " %" PRId64, l->sort.array.index, l->sort.array.element);
          break;
        default:
          assert (0);
          fprintf (stderr, "*** catbtor: invalid sort encountered\n");
          exit (1);
      }
    }
    else if (l->sort.id)
      printf (" %" PRId64, l->sort.id);
    for (j = 0; j < l->nargs; j++) printf (" %" PRId64, l->args[j]);
    if (l->tag == BTOR2_TAG_slice) printf (" %" PRId64 " %" PRId64, l->args[1], l->args[2]);
    if (l->tag == BTOR2_TAG_sext || l->tag == BTOR2_TAG_uext)
      printf (" %" PRId64, l->args[1]);
    if (l->constant) printf (" %s", l->constant);
    if (l->symbol) printf (" %s", l->symbol);
    fputc ('\n', stdout);
  }
  btor2parser_delete (reader);
  if (verbosity)
  {
    fprintf (stderr, "; [catbor] finished dumping BTOR model to '<stdout>'\n");
    fflush (stderr);
  }
  return 0;
}